

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.c
# Opt level: O0

wchar_t char_ptr_Compare(char *left,char *right)

{
  char *right_local;
  char *left_local;
  
  if ((left == (char *)0x0) && (right == (char *)0x0)) {
    left_local._4_4_ = L'\0';
  }
  else if (left == (char *)0x0) {
    left_local._4_4_ = L'\xffffffff';
  }
  else if (right == (char *)0x0) {
    left_local._4_4_ = L'\x01';
  }
  else {
    left_local._4_4_ = strcmp(left,right);
  }
  return left_local._4_4_;
}

Assistant:

int char_ptr_Compare(const char* left, const char* right)
{
    if ((left == NULL) &&
        (right == NULL))
    {
        return 0;
    }
    else if (left == NULL)
    {
        return -1;
    }
    else if (right == NULL)
    {
        return 1;
    }
    else
    {
        return strcmp(left, right);
    }
}